

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O2

void __thiscall
APowerDamage::ModifyDamage
          (APowerDamage *this,int damage,FName *damageType,int *newdamage,bool passive)

{
  TObjPtr<AActor> *obj;
  PType *this_00;
  hash_t hVar1;
  int iVar2;
  PClass *pPVar3;
  AActor *pAVar4;
  AInventory *pAVar5;
  TObjPtr<AInventory> *obj_00;
  int iVar6;
  int local_3c;
  FSoundID local_38;
  FName local_34;
  
  if (0 < damage && !passive) {
    pPVar3 = DObject::GetClass((DObject *)this);
    this_00 = pPVar3[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.HashNext;
    if ((this_00 == (PType *)0x0) ||
       (hVar1 = TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>::CountUsed
                          ((TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_> *)this_00
                          ), hVar1 == 0)) {
      iVar6 = damage * 4;
    }
    else {
      local_34 = (FName)damageType->Index;
      iVar2 = DmgFactors::Apply((DmgFactors *)this_00,&local_34,damage);
      iVar6 = 1;
      if (1 < iVar2) {
        iVar6 = iVar2;
      }
    }
    obj = &(this->super_APowerup).super_AInventory.Owner;
    pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
    if ((pAVar4 != (AActor *)0x0) && (damage < iVar6)) {
      pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
      local_38.ID = (this->super_APowerup).super_AInventory.super_AActor.ActiveSound.super_FSoundID.
                    ID;
      S_Sound(pAVar4,5,&local_38,1.0,0.0);
    }
    *newdamage = iVar6;
  }
  obj_00 = &(this->super_APowerup).super_AInventory.super_AActor.Inventory;
  pAVar5 = GC::ReadBarrier<AInventory>((AInventory **)obj_00);
  if (pAVar5 != (AInventory *)0x0) {
    pAVar5 = GC::ReadBarrier<AInventory>((AInventory **)obj_00);
    local_3c = damageType->Index;
    (*(pAVar5->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x3c])
              (pAVar5,(ulong)(uint)damage,&local_3c,newdamage,(ulong)passive);
  }
  return;
}

Assistant:

void APowerDamage::ModifyDamage(int damage, FName damageType, int &newdamage, bool passive)
{
	if (!passive && damage > 0)
	{
		int newdam;
		DmgFactors *df = GetClass()->DamageFactors;
		if (df != NULL && df->CountUsed() != 0)
		{
			newdam = MAX(1, df->Apply(damageType, damage));// don't allow zero damage as result of an underflow
		}
		else
		{
			newdam = damage * 4;
		}
		if (Owner != NULL && newdam > damage) S_Sound(Owner, 5, ActiveSound, 1.0f, ATTN_NONE);
		newdamage = newdam;
	}
	if (Inventory != NULL) Inventory->ModifyDamage(damage, damageType, newdamage, passive);
}